

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

void do_cmd_fire_at_nearest(void)

{
  _Bool _Var1;
  object *poVar2;
  command *pcVar3;
  object *bow;
  object *ammo;
  wchar_t dir;
  wchar_t i;
  
  bow = (object *)0x0;
  poVar2 = equipped_item_by_slot_name(player,"shooting");
  if ((poVar2 == (object *)0x0) || ((player->state).ammo_tval == L'\0')) {
    msg("You have nothing to fire with.");
  }
  else {
    for (ammo._4_4_ = 0; ammo._4_4_ < (int)(uint)z_info->quiver_size; ammo._4_4_ = ammo._4_4_ + 1) {
      if ((player->upkeep->quiver[ammo._4_4_] != (object *)0x0) &&
         ((uint)player->upkeep->quiver[ammo._4_4_]->tval == (player->state).ammo_tval)) {
        bow = player->upkeep->quiver[ammo._4_4_];
        break;
      }
    }
    if (bow == (object *)0x0) {
      msg("You have no ammunition in the quiver to fire.");
    }
    else {
      _Var1 = target_set_closest(L'\x11',(monster_predicate)0x0);
      if (_Var1) {
        cmdq_push(CMD_FIRE);
        pcVar3 = cmdq_peek();
        cmd_set_arg_item(pcVar3,"item",bow);
        pcVar3 = cmdq_peek();
        cmd_set_arg_target(pcVar3,"target",L'\x05');
      }
    }
  }
  return;
}

Assistant:

void do_cmd_fire_at_nearest(void) {
	int i, dir = DIR_TARGET;
	struct object *ammo = NULL;
	struct object *bow = equipped_item_by_slot_name(player, "shooting");

	/* Require a usable launcher */
	if (!bow || !player->state.ammo_tval) {
		msg("You have nothing to fire with.");
		return;
	}

	/* Find first eligible ammo in the quiver */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (!player->upkeep->quiver[i])
			continue;
		if (player->upkeep->quiver[i]->tval != player->state.ammo_tval)
			continue;
		ammo = player->upkeep->quiver[i];
		break;
	}

	/* Require usable ammo */
	if (!ammo) {
		msg("You have no ammunition in the quiver to fire.");
		return;
	}

	/* Require foe */
	if (!target_set_closest((TARGET_KILL | TARGET_QUIET), NULL)) return;

	/* Fire! */
	cmdq_push(CMD_FIRE);
	cmd_set_arg_item(cmdq_peek(), "item", ammo);
	cmd_set_arg_target(cmdq_peek(), "target", dir);
}